

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

Sign GEO::PCK::det_3d(double *p0,double *p1,double *p2)

{
  Sign SVar1;
  expansion *a13;
  uchar *sig;
  expansion *a11;
  expansion *a21;
  expansion *a22;
  expansion local_208;
  expansion local_1e8;
  expansion local_1c8;
  expansion local_1a8;
  expansion local_188;
  expansion local_168;
  expansion local_148;
  expansion local_128;
  expansion local_108;
  expansion local_e8 [8];
  
  SVar1 = det_3d_filter(p0,p1,p2);
  if (SVar1 == ZERO) {
    a11 = &local_108;
    local_208.length_ = 1;
    local_108.x_[0] = *p0;
    local_128.x_[0] = p0[1];
    a13 = &local_148;
    local_148.x_[0] = p0[2];
    a21 = &local_168;
    local_168.x_[0] = *p1;
    a22 = &local_188;
    local_188.x_[0] = p1[1];
    local_1a8.x_[0] = p1[2];
    local_1c8.x_[0] = *p2;
    local_1e8.x_[0] = p2[1];
    local_208.x_[0] = p2[2];
    local_e8[0].length_ = 0;
    local_e8[0].capacity_ = 0x18;
    local_208.capacity_ = local_208.length_;
    local_1e8.length_ = local_208.length_;
    local_1e8.capacity_ = local_208.length_;
    local_1c8.length_ = local_208.length_;
    local_1c8.capacity_ = local_208.length_;
    local_1a8.length_ = local_208.length_;
    local_1a8.capacity_ = local_208.length_;
    local_188.length_ = local_208.length_;
    local_188.capacity_ = local_208.length_;
    local_168.length_ = local_208.length_;
    local_168.capacity_ = local_208.length_;
    local_148.length_ = local_208.length_;
    local_148.capacity_ = local_208.length_;
    local_128.length_ = local_208.length_;
    local_128.capacity_ = local_208.length_;
    local_108.length_ = local_208.length_;
    local_108.capacity_ = local_208.length_;
    expansion::assign_det3x3
              (local_e8,a11,&local_128,a13,a21,a22,&local_1a8,&local_1c8,&local_1e8,&local_208);
    SVar1 = expansion::sign(local_e8,(EVP_PKEY_CTX *)a11,sig,(size_t *)a13,(uchar *)a21,(size_t)a22)
    ;
  }
  return SVar1;
}

Assistant:

Sign det_3d(
	    const double* p0, const double* p1, const double* p2
	) {
            PCK_STAT(cnt_det3d_total++);	  
	    Sign result = Sign(
		det_3d_filter(p0, p1, p2)
	    );
	    if(result == 0) {
		result = det_3d_exact(p0, p1, p2);
	    }
	    return result;
	}